

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O1

qsizetype __thiscall QIterable<QMetaSequence>::size(QIterable<QMetaSequence> *this)

{
  bool bVar1;
  qsizetype qVar2;
  void *j;
  QMetaSequence *this_00;
  void *pvVar3;
  
  pvVar3 = (void *)((this->m_iterable).m_pointer.d & 0xfffffffffffffffe);
  this_00 = &this->m_metaContainer;
  bVar1 = QMetaContainer::hasSize(&this_00->super_QMetaContainer);
  if (bVar1) {
    qVar2 = QMetaContainer::size(&this_00->super_QMetaContainer,pvVar3);
    return qVar2;
  }
  bVar1 = QMetaContainer::hasConstIterator(&this_00->super_QMetaContainer);
  if (bVar1) {
    j = QMetaContainer::constBegin(&this_00->super_QMetaContainer,pvVar3);
    pvVar3 = QMetaContainer::constEnd(&this_00->super_QMetaContainer,pvVar3);
    qVar2 = QMetaContainer::diffConstIterator(&this_00->super_QMetaContainer,pvVar3,j);
    QMetaContainer::destroyConstIterator(&this_00->super_QMetaContainer,j);
    QMetaContainer::destroyConstIterator(&this_00->super_QMetaContainer,pvVar3);
  }
  else {
    qVar2 = -1;
  }
  return qVar2;
}

Assistant:

qsizetype size() const
    {
        const void *container = constIterable();
        if (m_metaContainer.hasSize())
            return m_metaContainer.size(container);
        if (!m_metaContainer.hasConstIterator())
            return -1;

        const void *begin = m_metaContainer.constBegin(container);
        const void *end = m_metaContainer.constEnd(container);
        const qsizetype size = m_metaContainer.diffConstIterator(end, begin);
        m_metaContainer.destroyConstIterator(begin);
        m_metaContainer.destroyConstIterator(end);
        return size;
    }